

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* bech32::LocateErrors
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
             *__return_storage_ptr__,string *str,CharLimit limit)

{
  ulong uVar1;
  size_type __res;
  pointer *ppiVar2;
  char cVar3;
  size_type sVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer piVar9;
  pointer piVar10;
  bool bVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  char __c;
  int i_1;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ushort uVar27;
  uint *puVar28;
  undefined8 uVar29;
  long lVar30;
  size_t i;
  uint uVar31;
  size_type __new_size;
  undefined2 *__n;
  iterator __position;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  undefined2 *puVar36;
  uint uVar37;
  undefined2 *in_R11;
  long lVar38;
  char *__s;
  pointer piVar39;
  ushort *puVar40;
  long in_FS_OFFSET;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  data values;
  string error_message;
  string hrp;
  int local_154;
  int local_dc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_88;
  int local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  __new_size = str->_M_string_length - limit;
  if (str->_M_string_length < limit || __new_size == 0) {
    bVar11 = anon_unknown_0::CheckCharacters(str,&local_a8);
    piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
    piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (bVar11) {
      uVar16 = str->_M_string_length;
      if (uVar16 == 0) {
LAB_0075012f:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Missing separator",(allocator<char> *)&local_58
                  );
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        lVar30 = -uVar16;
        uVar23 = 0;
        do {
          if (-uVar23 == uVar16) goto LAB_0075012f;
          uVar1 = uVar23 - 1;
          lVar24 = uVar23 + (uVar16 - 1);
          uVar23 = uVar1;
        } while ((str->_M_dataplus)._M_p[lVar24] != '1');
        __res = uVar16 + uVar1;
        iVar12 = (int)__res;
        if ((-uVar1 == uVar16) || (uVar16 <= uVar16 + uVar1 + 6)) {
          local_58._M_dataplus._M_p._0_4_ = iVar12;
          if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_58);
            piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          else {
            *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar12;
            piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
          }
          piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"Invalid separator position",
                     (allocator<char> *)&local_58);
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = piVar9;
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar39;
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = piVar10;
        }
        else {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                    (&local_58,__res);
          uVar23 = 0;
          do {
            cVar3 = (str->_M_dataplus)._M_p[uVar23];
            __c = cVar3 + ' ';
            if (0x19 < (byte)(cVar3 + 0xbfU)) {
              __c = cVar3;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_58,__c);
            uVar23 = uVar23 + 1;
          } while (uVar23 < __res);
          sVar4 = str->_M_string_length;
          uVar23 = ~uVar1;
          __n = (undefined2 *)(uVar23 + lVar30 + sVar4);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_c0,(size_type)__n,(allocator_type *)&local_88);
          if (uVar16 + uVar1 + 1 < str->_M_string_length) {
            lVar24 = 1;
            do {
              iVar12 = iVar12 + 1;
              if ((anonymous_namespace)::CHARSET_REV
                  [(byte)(str->_M_dataplus)._M_p[uVar1 + uVar16 + lVar24]] == 0xff) {
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = iVar12;
                if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&local_a8,
                             (iterator)
                             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_88);
                  piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                else {
                  *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar12;
                  piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1;
                }
                piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (int *)0x0;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,"Invalid Base 32 character",
                           (allocator<char> *)&local_88);
                (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start = piVar9;
                (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish = piVar39;
                (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = piVar10;
                goto LAB_007503b7;
              }
              local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24 + -1] =
                   (anonymous_namespace)::CHARSET_REV
                   [(byte)(str->_M_dataplus)._M_p[uVar1 + uVar16 + lVar24]];
              lVar25 = lVar24 + __res;
              lVar24 = lVar24 + 1;
            } while (lVar25 + 1U < str->_M_string_length);
          }
          local_60[0] = 1;
          local_60[1] = 2;
          lVar24 = 0;
          bVar11 = false;
          do {
            iVar12 = *(int *)((long)local_60 + lVar24);
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            anon_unknown_0::PreparePolynomialCoefficients(&local_d8,&local_58,&local_c0);
            uVar13 = anon_unknown_0::PolyMod
                               ((anon_unknown_0 *)
                                local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (data *)local_d8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
            if (1 < iVar12 - 1U) {
LAB_0075042f:
              __assert_fail("encoding == Encoding::BECH32 || encoding == Encoding::BECH32M",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/bech32.cpp"
                            ,0x7b,
                            "uint32_t bech32::(anonymous namespace)::EncodingConstant(Encoding)");
            }
            uVar34 = 0x2bc830a3;
            if (iVar12 == 1) {
              uVar34 = 1;
            }
            if (uVar13 == uVar34) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_dc);
              (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            }
            else {
              uVar37 = ((uVar13 ^ uVar34) & 0x1f) * 0x100401;
              puVar28 = &(anonymous_namespace)::SYNDROME_CONSTS;
              lVar25 = 0;
              do {
                bVar5 = (byte)lVar25 & 0x1f;
                if (((uVar13 ^ uVar34) >> bVar5 & 0x20) == 0) {
                  uVar31 = 0 >> bVar5;
                }
                else {
                  uVar31 = *puVar28;
                }
                uVar37 = uVar37 ^ uVar31;
                lVar25 = lVar25 + 1;
                puVar28 = puVar28 + 1;
              } while (lVar25 != 0x19);
              uVar31 = uVar37 >> 0x14;
              if (0x3fffffff < uVar37) {
LAB_0075047b:
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_out_of_range_fmt
                            ("array::at: __n (which is %zu) >= _Nm (which is %zu)");
LAB_007504a5:
                  uVar29 = 0x3ff;
                  puVar36 = in_R11;
LAB_007504be:
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    uVar20 = std::__throw_out_of_range_fmt
                                       ("array::at: __n (which is %zu) >= _Nm (which is %zu)",
                                        puVar36,uVar29);
LAB_007504e6:
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      uVar29 = std::__throw_out_of_range_fmt
                                         ("array::at: __n (which is %zu) >= _Nm (which is %zu)",
                                          uVar20,0x400);
                      if ((anon_unknown_0 *)
                          local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start != (anon_unknown_0 *)0x0) {
                        operator_delete(local_d8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_d8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_d8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_c0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_c0.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_c0.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_58._M_dataplus._M_p != &local_58.field_2) {
                        operator_delete(local_58._M_dataplus._M_p,
                                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                                 local_58.field_2._M_local_buf[0]) + 1);
                      }
                      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        _Unwind_Resume(uVar29);
                      }
                    }
                  }
                }
                goto LAB_00750701;
              }
              uVar21 = uVar37 & 0x3ff;
              uVar37 = uVar37 >> 10 & 0x3ff;
              uVar16 = (ulong)uVar37;
              iVar14 = (int)*(short *)(&DAT_0089618e + (ulong)uVar21 * 2);
              iVar22 = (int)*(short *)(&DAT_0089618e + uVar16 * 2);
              if ((((*(short *)(&DAT_0089618e + (ulong)uVar21 * 2) == -1) ||
                   (*(short *)(&DAT_0089618e + uVar16 * 2) == -1)) ||
                  (*(short *)(&DAT_0089618e + (ulong)uVar31 * 2) == -1)) ||
                 (0x401004 <
                  (iVar22 * 2 - (*(short *)(&DAT_0089618e + (ulong)uVar31 * 2) + iVar14)) *
                  -0x40100401 + 0x200804U)) {
                if ((sVar4 + lVar30) - 1 != uVar1) {
                  uVar26 = (ulong)iVar22;
                  uVar32 = (ulong)iVar14;
                  puVar40 = &(anonymous_namespace)::tables;
                  lVar25 = uVar26 * 2;
                  iVar14 = 0x3ff;
                  uVar33 = uVar32;
                  lVar38 = 1;
                  do {
                    if (uVar37 == 0) {
                      uVar15 = 0;
                    }
                    else {
                      uVar15 = (uint)*(short *)((uVar26 / 0x3ff) * -0x7fe + lVar25 + 0x89598e +
                                               lVar38 * 2);
                    }
                    if (uVar31 == uVar15) goto LAB_0074fd9c;
                    uVar15 = uVar15 ^ uVar31;
                    if (0x3ff < uVar15) {
                      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00750701;
                      std::__throw_out_of_range_fmt
                                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",
                                 (long)(int)uVar15,0x400);
                      goto LAB_0075042f;
                    }
                    if (uVar21 == 0) {
                      uVar17 = uVar16;
                      if (uVar37 != 0) goto LAB_0074fc29;
                    }
                    else {
                      uVar27 = *(ushort *)
                                ((uVar33 / 0x3ff) * -0x7fe + uVar32 * 2 + 0x89598e + lVar38 * 2);
                      if (uVar37 != (int)(short)uVar27) {
                        uVar17 = (ulong)(int)(uVar37 ^ (int)(short)uVar27);
                        if (0x3ff < uVar27) {
                          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00750701;
                          std::__throw_out_of_range_fmt
                                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar17,
                                     0x400);
                          goto LAB_0075047b;
                        }
LAB_0074fc29:
                        iVar35 = (int)*(short *)(&DAT_0089618e + (long)(int)uVar15 * 2) -
                                 (int)*(short *)(&DAT_0089618e + uVar17 * 2);
                        iVar22 = (int)((ulong)((long)(iVar35 + 0x3ff) * -0x7fdff7fd) >> 0x20) +
                                 iVar35 + 0x3ff;
                        uVar15 = iVar35 + ((iVar22 >> 9) - (iVar22 >> 0x1f)) * -0x3ff + 0x3ff;
                        puVar36 = (undefined2 *)(long)(int)uVar15;
                        if ((puVar36 < __n) &&
                           (in_R11 = (undefined2 *)(lVar38 + -1), in_R11 != puVar36)) {
                          if (uVar21 == 0) {
                            uVar20 = uVar16;
                            if (uVar37 != 0) goto LAB_0074fd04;
                          }
                          else {
                            uVar27 = (&(anonymous_namespace)::tables)
                                     [(uint)((int)((long)puVar36 + uVar32) +
                                            (int)(((long)puVar36 + uVar32) / 0x3ff) * -0x3ff)];
                            if (uVar37 != (int)(short)uVar27) {
                              uVar20 = (ulong)(int)(uVar37 ^ (int)(short)uVar27);
                              if (0x3ff < uVar27) goto LAB_007504e6;
LAB_0074fd04:
                              if ((undefined2 *)0x3fe < in_R11) goto LAB_007504a5;
                              if (0x3fe < uVar15) {
                                uVar29 = 0x3ff;
                                goto LAB_007504be;
                              }
                              in_R11 = &(anonymous_namespace)::tables;
                              uVar27 = (&(anonymous_namespace)::tables)[(long)puVar36] ^ *puVar40;
                              if (0x3ff < uVar27) {
                                uVar29 = 0x400;
                                puVar36 = (undefined2 *)(long)(short)uVar27;
                                goto LAB_007504be;
                              }
                              if (((((int)*(short *)(&DAT_0089618e + uVar17 * 2) + uVar15 * 0x1a) -
                                   (int)*(short *)(&DAT_0089618e + (long)(short)uVar27 * 2)) *
                                   0x3e0f83e1 + 0x3e0f85d < 0x7c1f07d) &&
                                 ((((int)*(short *)(&DAT_0089618e + uVar20 * 2) -
                                   (int)*(short *)(&DAT_0089618e + (long)(short)uVar27 * 2)) +
                                  iVar14) * 0x3e0f83e1 + 0x3e0f83eU < 0x7c1f07d)) {
                                if (puVar36 < (undefined2 *)(lVar38 + -1)) {
                                  iVar14 = (int)str->_M_string_length;
                                  local_dc = iVar14 - (int)lVar38;
                                  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_finish ==
                                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage) {
                                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                              (&local_88,
                                               (iterator)
                                               local_88.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish,&local_dc);
                                    iVar14 = (int)str->_M_string_length;
                                    __position._M_current =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                                  }
                                  else {
                                    *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish = local_dc;
                                    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish + 1;
                                    __position._M_current =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                                  }
                                  local_dc = iVar14 + ~uVar15;
                                  if (__position._M_current ==
                                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage) {
                                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                              (&local_88,__position,&local_dc);
                                    break;
                                  }
                                }
                                else {
                                  iVar14 = (int)str->_M_string_length;
                                  local_dc = ~uVar15 + iVar14;
                                  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_finish ==
                                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage) {
                                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                              (&local_88,
                                               (iterator)
                                               local_88.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish,&local_dc);
                                    iVar14 = (int)str->_M_string_length;
                                    __position._M_current =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                                  }
                                  else {
                                    *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish = local_dc;
                                    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish + 1;
                                    __position._M_current =
                                         local_88.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                                  }
                                  local_dc = iVar14 - (int)lVar38;
                                  if (__position._M_current ==
                                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_end_of_storage) {
                                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                              (&local_88,__position,&local_dc);
                                    break;
                                  }
                                }
                                *__position._M_current = local_dc;
                                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish = __position._M_current;
                                goto LAB_007500ab;
                              }
                            }
                          }
                        }
                      }
                    }
LAB_0074fd9c:
                    uVar26 = uVar26 + 1;
                    uVar33 = uVar33 + 1;
                    iVar14 = iVar14 + 0x1a;
                    puVar40 = puVar40 + 1;
                    bVar41 = lVar38 != sVar4 + lVar30 + uVar23 +
                                       (ulong)(uVar23 + sVar4 + lVar30 == 0);
                    lVar38 = lVar38 + 1;
                  } while (bVar41);
                }
              }
              else {
                iVar22 = iVar22 - iVar14;
                iVar35 = (int)((ulong)((long)(iVar22 + 0x3ff) * -0x7fdff7fd) >> 0x20) + iVar22 +
                         0x3ff;
                uVar37 = iVar22 + ((iVar35 >> 9) - (iVar35 >> 0x1f)) * -0x3ff + 0x3ff;
                if (((undefined2 *)(long)(int)uVar37 < __n) &&
                   (iVar14 * 0x3e0f83e1 + uVar37 * 0x4d9364da + 0x3e0f83e < 0x7c1f07d)) {
                  local_dc = ~uVar37 + (int)str->_M_string_length;
                  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&local_88,
                               (iterator)
                               local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_dc);
                  }
                  else {
                    *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_dc;
LAB_007500ab:
                    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
              }
              piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) ||
                 ((local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish &&
                  ((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) <
                   (ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start))))) {
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (int *)0x0;
                if (piVar39 != (pointer)0x0) {
                  operator_delete(piVar39,(long)piVar9 - (long)piVar39);
                }
                if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_154 = iVar12;
                }
                bVar11 = (bool)(bVar11 | local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start !=
                                         local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish);
              }
            }
            if ((anon_unknown_0 *)
                local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (anon_unknown_0 *)0x0) {
              operator_delete(local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (uVar13 == uVar34) goto LAB_007503b7;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 8);
          pcVar18 = "Invalid Bech32 checksum";
          if (local_154 != 1) {
            pcVar18 = "Invalid checksum";
          }
          if (!bVar11) {
            pcVar18 = "Invalid checksum";
          }
          __s = "Invalid Bech32m checksum";
          if (local_154 != 2) {
            __s = pcVar18;
          }
          if (!bVar11) {
            __s = pcVar18;
          }
          ppiVar2 = &local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)ppiVar2;
          sVar19 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar19);
          (__return_storage_ptr__->first)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->first).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                     (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          if ((pointer *)
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != ppiVar2) {
            operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
LAB_007503b7:
          if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_c0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
      }
    }
    else {
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"Invalid character or mixed case",
                 (allocator<char> *)&local_58);
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = piVar39;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar9;
      (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = piVar10;
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(&local_a8,__new_size);
    piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage;
    piVar9 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    piVar39 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    auVar8 = _DAT_0082fff0;
    auVar7 = _DAT_007fe090;
    auVar6 = _DAT_007fe080;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar16 = (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish +
               (-4 - (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
      auVar44._8_4_ = (int)uVar16;
      auVar44._0_8_ = uVar16;
      auVar44._12_4_ = (int)(uVar16 >> 0x20);
      auVar42._0_8_ = uVar16 >> 2;
      auVar42._8_8_ = auVar44._8_8_ >> 2;
      uVar23 = 0;
      auVar42 = auVar42 ^ _DAT_007fe090;
      do {
        iVar22 = (int)uVar23;
        auVar43._8_4_ = iVar22;
        auVar43._0_8_ = uVar23;
        auVar43._12_4_ = (int)(uVar23 >> 0x20);
        auVar44 = (auVar43 | auVar6) ^ auVar7;
        iVar14 = auVar42._4_4_;
        iVar12 = (int)limit;
        if ((bool)(~(auVar44._4_4_ == iVar14 && auVar42._0_4_ < auVar44._0_4_ ||
                    iVar14 < auVar44._4_4_) & 1)) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar23] = iVar12 + iVar22;
        }
        if ((auVar44._12_4_ != auVar42._12_4_ || auVar44._8_4_ <= auVar42._8_4_) &&
            auVar44._12_4_ <= auVar42._12_4_) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar23 + 1] = iVar12 + iVar22 + 1;
        }
        auVar44 = (auVar43 | auVar8) ^ auVar7;
        iVar35 = auVar44._4_4_;
        if (iVar35 <= iVar14 && (iVar35 != iVar14 || auVar44._0_4_ <= auVar42._0_4_)) {
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar23 + 2] = iVar12 + iVar22 + 2;
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar23 + 3] = iVar12 + iVar22 + 3;
        }
        uVar23 = uVar23 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar23);
    }
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Bech32 string too long",
               (allocator<char> *)&local_58);
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = piVar39;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar9;
    (__return_storage_ptr__->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = piVar10;
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00750701:
  __stack_chk_fail();
}

Assistant:

std::pair<std::string, std::vector<int>> LocateErrors(const std::string& str, CharLimit limit) {
    std::vector<int> error_locations{};

    if (str.size() > limit) {
        error_locations.resize(str.size() - limit);
        std::iota(error_locations.begin(), error_locations.end(), static_cast<int>(limit));
        return std::make_pair("Bech32 string too long", std::move(error_locations));
    }

    if (!CheckCharacters(str, error_locations)){
        return std::make_pair("Invalid character or mixed case", std::move(error_locations));
    }

    size_t pos = str.rfind('1');
    if (pos == str.npos) {
        return std::make_pair("Missing separator", std::vector<int>{});
    }
    if (pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        error_locations.push_back(pos);
        return std::make_pair("Invalid separator position", std::move(error_locations));
    }

    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }

    size_t length = str.size() - 1 - pos; // length of data part
    data values(length);
    for (size_t i = pos + 1; i < str.size(); ++i) {
        unsigned char c = str[i];
        int8_t rev = CHARSET_REV[c];
        if (rev == -1) {
            error_locations.push_back(i);
            return std::make_pair("Invalid Base 32 character", std::move(error_locations));
        }
        values[i - pos - 1] = rev;
    }

    // We attempt error detection with both bech32 and bech32m, and choose the one with the fewest errors
    // We can't simply use the segwit version, because that may be one of the errors
    std::optional<Encoding> error_encoding;
    for (Encoding encoding : {Encoding::BECH32, Encoding::BECH32M}) {
        std::vector<int> possible_errors;
        // Recall that (expanded hrp + values) is interpreted as a list of coefficients of a polynomial
        // over GF(32). PolyMod computes the "remainder" of this polynomial modulo the generator G(x).
        auto enc = PreparePolynomialCoefficients(hrp, values);
        uint32_t residue = PolyMod(enc) ^ EncodingConstant(encoding);

        // All valid codewords should be multiples of G(x), so this remainder (after XORing with the encoding
        // constant) should be 0 - hence 0 indicates there are no errors present.
        if (residue != 0) {
            // If errors are present, our polynomial must be of the form C(x) + E(x) where C is the valid
            // codeword (a multiple of G(x)), and E encodes the errors.
            uint32_t syn = Syndrome(residue);

            // Unpack the three 10-bit syndrome values
            int s0 = syn & 0x3FF;
            int s1 = (syn >> 10) & 0x3FF;
            int s2 = syn >> 20;

            // Get the discrete logs of these values in GF1024 for more efficient computation
            int l_s0 = GF1024_LOG.at(s0);
            int l_s1 = GF1024_LOG.at(s1);
            int l_s2 = GF1024_LOG.at(s2);

            // First, suppose there is only a single error. Then E(x) = e1*x^p1 for some position p1
            // Then s0 = E((e)^997) = e1*(e)^(997*p1) and s1 = E((e)^998) = e1*(e)^(998*p1)
            // Therefore s1/s0 = (e)^p1, and by the same logic, s2/s1 = (e)^p1 too.
            // Hence, s1^2 == s0*s2, which is exactly the condition we check first:
            if (l_s0 != -1 && l_s1 != -1 && l_s2 != -1 && (2 * l_s1 - l_s2 - l_s0 + 2046) % 1023 == 0) {
                // Compute the error position p1 as l_s1 - l_s0 = p1 (mod 1023)
                size_t p1 = (l_s1 - l_s0 + 1023) % 1023; // the +1023 ensures it is positive
                // Now because s0 = e1*(e)^(997*p1), we get e1 = s0/((e)^(997*p1)). Remember that (e)^1023 = 1,
                // so 1/((e)^997) = (e)^(1023-997).
                int l_e1 = l_s0 + (1023 - 997) * p1;
                // Finally, some sanity checks on the result:
                // - The error position should be within the length of the data
                // - e1 should be in GF(32), which implies that e1 = (e)^(33k) for some k (the 31 non-zero elements
                // of GF(32) form an index 33 subgroup of the 1023 non-zero elements of GF(1024)).
                if (p1 < length && !(l_e1 % 33)) {
                    // Polynomials run from highest power to lowest, so the index p1 is from the right.
                    // We don't return e1 because it is dangerous to suggest corrections to the user,
                    // the user should check the address themselves.
                    possible_errors.push_back(str.size() - p1 - 1);
                }
            // Otherwise, suppose there are two errors. Then E(x) = e1*x^p1 + e2*x^p2.
            } else {
                // For all possible first error positions p1
                for (size_t p1 = 0; p1 < length; ++p1) {
                    // We have guessed p1, and want to solve for p2. Recall that E(x) = e1*x^p1 + e2*x^p2, so
                    // s0 = E((e)^997) = e1*(e)^(997^p1) + e2*(e)^(997*p2), and similar for s1 and s2.
                    //
                    // Consider s2 + s1*(e)^p1
                    //          = 2e1*(e)^(999^p1) + e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //          = e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //    (Because we are working in characteristic 2.)
                    //          = e2*(e)^(998*p2) ((e)^p2 + (e)^p1)
                    //
                    int s2_s1p1 = s2 ^ (s1 == 0 ? 0 : GF1024_EXP.at((l_s1 + p1) % 1023));
                    if (s2_s1p1 == 0) continue;
                    int l_s2_s1p1 = GF1024_LOG.at(s2_s1p1);

                    // Similarly, s1 + s0*(e)^p1
                    //          = e2*(e)^(997*p2) ((e)^p2 + (e)^p1)
                    int s1_s0p1 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p1) % 1023));
                    if (s1_s0p1 == 0) continue;
                    int l_s1_s0p1 = GF1024_LOG.at(s1_s0p1);

                    // So, putting these together, we can compute the second error position as
                    // (e)^p2 = (s2 + s1^p1)/(s1 + s0^p1)
                    // p2 = log((e)^p2)
                    size_t p2 = (l_s2_s1p1 - l_s1_s0p1 + 1023) % 1023;

                    // Sanity checks that p2 is a valid position and not the same as p1
                    if (p2 >= length || p1 == p2) continue;

                    // Now we want to compute the error values e1 and e2.
                    // Similar to above, we compute s1 + s0*(e)^p2
                    //          = e1*(e)^(997*p1) ((e)^p1 + (e)^p2)
                    int s1_s0p2 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p2) % 1023));
                    if (s1_s0p2 == 0) continue;
                    int l_s1_s0p2 = GF1024_LOG.at(s1_s0p2);

                    // And compute (the log of) 1/((e)^p1 + (e)^p2))
                    int inv_p1_p2 = 1023 - GF1024_LOG.at(GF1024_EXP.at(p1) ^ GF1024_EXP.at(p2));

                    // Then (s1 + s0*(e)^p1) * (1/((e)^p1 + (e)^p2)))
                    //         = e2*(e)^(997*p2)
                    // Then recover e2 by dividing by (e)^(997*p2)
                    int l_e2 = l_s1_s0p1 + inv_p1_p2 + (1023 - 997) * p2;
                    // Check that e2 is in GF(32)
                    if (l_e2 % 33) continue;

                    // In the same way, (s1 + s0*(e)^p2) * (1/((e)^p1 + (e)^p2)))
                    //         = e1*(e)^(997*p1)
                    // So recover e1 by dividing by (e)^(997*p1)
                    int l_e1 = l_s1_s0p2 + inv_p1_p2 + (1023 - 997) * p1;
                    // Check that e1 is in GF(32)
                    if (l_e1 % 33) continue;

                    // Again, we do not return e1 or e2 for safety.
                    // Order the error positions from the left of the string and return them
                    if (p1 > p2) {
                        possible_errors.push_back(str.size() - p1 - 1);
                        possible_errors.push_back(str.size() - p2 - 1);
                    } else {
                        possible_errors.push_back(str.size() - p2 - 1);
                        possible_errors.push_back(str.size() - p1 - 1);
                    }
                    break;
                }
            }
        } else {
            // No errors
            return std::make_pair("", std::vector<int>{});
        }

        if (error_locations.empty() || (!possible_errors.empty() && possible_errors.size() < error_locations.size())) {
            error_locations = std::move(possible_errors);
            if (!error_locations.empty()) error_encoding = encoding;
        }
    }
    std::string error_message = error_encoding == Encoding::BECH32M ? "Invalid Bech32m checksum"
                              : error_encoding == Encoding::BECH32 ? "Invalid Bech32 checksum"
                              : "Invalid checksum";

    return std::make_pair(error_message, std::move(error_locations));
}